

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::LDForceModifier::genRandomForceAndTorque
          (LDForceModifier *this,Vector3d *force,Vector3d *torque,uint index)

{
  double *pdVar1;
  uint in_ECX;
  Vector<double,_3U> *in_RDX;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  RectMatrix<double,_6U,_6U> *m;
  result_type_conflict rVar2;
  Vector<double,_6U> generalForce;
  Vector<double,_6U> Z;
  RandNumGen *in_stack_fffffffffffffd98;
  double dVar3;
  normal_distribution<double> *in_stack_fffffffffffffda0;
  HydroProp *in_stack_fffffffffffffda8;
  Vector<double,_6U> *in_stack_fffffffffffffdc0;
  Vector<double,_6U> local_80;
  Vector<double,_6U> local_50;
  uint local_1c;
  Vector<double,_3U> *local_18;
  Vector<double,_3U> *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector<double,_6U>::Vector(&local_50);
  Vector<double,_6U>::Vector(&local_80);
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  m = (RectMatrix<double,_6U,_6U> *)
      std::normal_distribution<double>::operator()
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,0);
  *pdVar1 = (double)m;
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,1);
  *pdVar1 = rVar2;
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,2);
  *pdVar1 = rVar2;
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,3);
  *pdVar1 = rVar2;
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,4);
  *pdVar1 = rVar2;
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffda0);
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pdVar1 = Vector<double,_6U>::operator[](&local_50,5);
  *pdVar1 = rVar2;
  std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
            ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)(in_RDI + 0x40),
             (ulong)local_1c);
  HydroProp::getS(in_stack_fffffffffffffda8);
  OpenMD::operator*(m,in_stack_fffffffffffffdc0);
  Vector<double,_6U>::operator=
            ((Vector<double,_6U> *)in_stack_fffffffffffffda8,
             (Vector<double,_6U> *)in_stack_fffffffffffffda0);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x2a0d6e);
  pdVar1 = Vector<double,_6U>::operator[](&local_80,0);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_10,0);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_6U>::operator[](&local_80,1);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_10,1);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_6U>::operator[](&local_80,2);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_10,2);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_6U>::operator[](&local_80,3);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_18,0);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_6U>::operator[](&local_80,4);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_18,1);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_6U>::operator[](&local_80,5);
  dVar3 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](local_18,2);
  *pdVar1 = dVar3;
  return;
}

Assistant:

void LDForceModifier::genRandomForceAndTorque(Vector3d& force,
                                                Vector3d& torque,
                                                unsigned int index) {
    Vector<RealType, 6> Z;
    Vector<RealType, 6> generalForce;

    Z[0] = forceDistribution_(*randNumGen_);
    Z[1] = forceDistribution_(*randNumGen_);
    Z[2] = forceDistribution_(*randNumGen_);
    Z[3] = forceDistribution_(*randNumGen_);
    Z[4] = forceDistribution_(*randNumGen_);
    Z[5] = forceDistribution_(*randNumGen_);

    generalForce = hydroProps_[index]->getS() * Z;

    force[0]  = generalForce[0];
    force[1]  = generalForce[1];
    force[2]  = generalForce[2];
    torque[0] = generalForce[3];
    torque[1] = generalForce[4];
    torque[2] = generalForce[5];
  }